

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall icu_63::PluralFormat::copyObjects(PluralFormat *this,PluralFormat *other)

{
  int iVar1;
  NumberFormat *pNVar2;
  undefined4 extraout_var;
  PluralRules *pPVar3;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__child_stack;
  void *in_R8;
  undefined1 local_1c [8];
  UErrorCode status;
  PluralFormat *other_local;
  PluralFormat *this_local;
  
  local_1c._0_4_ = U_ZERO_ERROR;
  unique0x100001fa = other;
  other_local = this;
  if ((this->numberFormat != (NumberFormat *)0x0) && (this->numberFormat != (NumberFormat *)0x0)) {
    (*(this->numberFormat->super_Format).super_UObject._vptr_UObject[1])();
  }
  if (((this->pluralRulesWrapper).pluralRules != (PluralRules *)0x0) &&
     (pPVar3 = (this->pluralRulesWrapper).pluralRules, pPVar3 != (PluralRules *)0x0)) {
    (*(pPVar3->super_UObject)._vptr_UObject[1])();
  }
  if (stack0xffffffffffffffe8->numberFormat == (NumberFormat *)0x0) {
    other = (PluralFormat *)local_1c;
    pNVar2 = NumberFormat::createInstance(&this->locale,(UErrorCode *)other);
    this->numberFormat = pNVar2;
    __child_stack = extraout_RDX;
  }
  else {
    iVar1 = (*(stack0xffffffffffffffe8->numberFormat->super_Format).super_UObject._vptr_UObject[4])
                      ();
    pNVar2 = (NumberFormat *)CONCAT44(extraout_var,iVar1);
    this->numberFormat = pNVar2;
    __child_stack = extraout_RDX_00;
  }
  if ((stack0xffffffffffffffe8->pluralRulesWrapper).pluralRules == (PluralRules *)0x0) {
    pPVar3 = PluralRules::forLocale(&this->locale,(UErrorCode *)local_1c);
    (this->pluralRulesWrapper).pluralRules = pPVar3;
  }
  else {
    iVar1 = PluralRules::clone((stack0xffffffffffffffe8->pluralRulesWrapper).pluralRules,
                               (__fn *)other,__child_stack,(int)pNVar2,in_R8);
    (this->pluralRulesWrapper).pluralRules = (PluralRules *)CONCAT44(extraout_var_00,iVar1);
  }
  return;
}

Assistant:

void
PluralFormat::copyObjects(const PluralFormat& other) {
    UErrorCode status = U_ZERO_ERROR;
    if (numberFormat != NULL) {
        delete numberFormat;
    }
    if (pluralRulesWrapper.pluralRules != NULL) {
        delete pluralRulesWrapper.pluralRules;
    }

    if (other.numberFormat == NULL) {
        numberFormat = NumberFormat::createInstance(locale, status);
    } else {
        numberFormat = (NumberFormat*)other.numberFormat->clone();
    }
    if (other.pluralRulesWrapper.pluralRules == NULL) {
        pluralRulesWrapper.pluralRules = PluralRules::forLocale(locale, status);
    } else {
        pluralRulesWrapper.pluralRules = other.pluralRulesWrapper.pluralRules->clone();
    }
}